

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall
pbrt::RealisticCamera::RenderExitPupil(RealisticCamera *this,Float sx,Float sy,char *filename)

{
  undefined8 uVar1;
  LensElementInterface *pLVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Allocator alloc;
  long lVar6;
  int y;
  long lVar7;
  int x;
  long lVar8;
  float fVar9;
  float fVar10;
  Float value;
  undefined1 auVar11 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Image image;
  allocator<char> local_29d;
  Float local_29c;
  aligned_storage_t<sizeof(float),_alignof(float)> local_298;
  float local_294;
  char *local_290;
  string local_288;
  undefined1 local_268 [8];
  undefined1 auStack_260 [64];
  ulong uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined1 auStack_1e0 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_1d8;
  ulong uStack_1c8;
  undefined1 auStack_1c0 [8];
  optional<int> oStack_1b8;
  optional<float> oStack_1b0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_1a8;
  ulong uStack_1a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_198;
  undefined1 local_168 [16];
  ColorEncodingHandle local_150;
  Image local_148;
  undefined1 extraout_var [60];
  
  local_29c = sy;
  local_298 = (aligned_storage_t<sizeof(float),_alignof(float)>)sx;
  local_268 = (undefined1  [8])((long)auStack_260 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Y","");
  local_150.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 1;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268;
  Image::Image(&local_148,Float,(Point2i)0x80000000800,channels,&local_150,alloc);
  local_290 = filename;
  if (local_268 != (undefined1  [8])((long)auStack_260 + 8)) {
    operator_delete((void *)local_268,CONCAT44(auStack_260._12_4_,auStack_260._8_4_) + 1);
  }
  lVar6 = 0;
  lVar7 = 0;
  do {
    fVar9 = (float)(int)lVar7 / 2047.0;
    fVar10 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
    auVar4 = vfnmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar10)),ZEXT416((uint)fVar10),
                              ZEXT416((uint)(1.0 - fVar9)));
    fVar10 = auVar4._0_4_;
    local_294 = fVar10 * fVar10;
    local_168 = ZEXT416((uint)(fVar10 - local_29c));
    lVar8 = 0;
    do {
      fVar9 = (float)(int)lVar8 / 2047.0;
      pLVar2 = (this->elementInterfaces).ptr;
      sVar3 = (this->elementInterfaces).nStored;
      fVar10 = pLVar2[sVar3 - 1].apertureRadius;
      value = 1.0;
      auVar5 = vfnmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar10)),ZEXT416((uint)fVar10),
                                ZEXT416((uint)(1.0 - fVar9)));
      auVar4 = vfmadd213ss_fma(auVar5,auVar5,ZEXT416((uint)local_294));
      if (auVar4._0_4_ <= fVar10 * fVar10) {
        auStack_260._12_4_ = pLVar2[sVar3 - 1].thickness;
        auVar4 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ - (float)local_298)),
                               ZEXT416((uint)local_168._0_4_),0x10);
        local_268._4_4_ = local_29c;
        local_268._0_4_ = local_298;
        auStack_260._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
        uVar1 = vmovlps_avx(auVar4);
        auStack_260._4_4_ = (undefined4)uVar1;
        auStack_260._8_4_ = (undefined4)((ulong)uVar1 >> 0x20);
        auStack_260._16_8_ = auStack_260._16_8_ & 0xffffffff00000000;
        auStack_260._24_8_ = 0;
        auVar11._0_4_ = TraceLensesFromFilm(this,(Ray *)local_268,(Ray *)0x0);
        auVar11._4_60_ = extraout_var;
        uVar1 = vcmpss_avx512f(auVar11._0_16_,ZEXT416(0),4);
        value = (Float)((uint)((byte)uVar1 & 1) * 0x3f000000);
      }
      Image::SetChannel(&local_148,(Point2i)(lVar6 + lVar8),0,value);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x800);
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x100000000;
  } while (lVar7 != 0x800);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,local_290,&local_29d);
  _Stack_198._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_198._M_impl.super__Rb_tree_header._M_header;
  local_1a8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
               )0x0;
  uStack_1a0 = 0;
  _Stack_198._M_impl._0_8_ = 0;
  _Stack_198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_198._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8 = 0;
  auStack_1e0 = (undefined1  [8])0x0;
  aStack_1d8._0_8_ = 0;
  aStack_1d8._8_8_ = 0;
  uStack_1c8 = 0;
  auStack_1c0 = (undefined1  [8])0x0;
  oStack_1b8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_1b8.set = false;
  oStack_1b8._5_3_ = 0;
  oStack_1b0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_1b0.set = false;
  oStack_1b0._5_3_ = 0;
  auStack_260._56_8_ = 0;
  uStack_220 = 0;
  uStack_218 = 0;
  uStack_210 = 0;
  uStack_208 = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  local_268._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_268[4] = false;
  local_268._5_3_ = 0;
  auStack_260._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
  auStack_260._4_4_ = 0.0;
  auStack_260._8_4_ = 0;
  auStack_260._12_4_ = 0;
  auStack_260._16_8_ = 0;
  auStack_260._24_8_ = 0;
  auStack_260._32_8_ = 0;
  auStack_260._40_8_ = 0;
  auStack_260._48_8_ = 0;
  _Stack_198._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_198._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_198._M_impl.super__Rb_tree_header._M_header._M_left;
  Image::Write(&local_148,&local_288,(ImageMetadata *)local_268);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&_Stack_198);
  if (uStack_1a0._0_1_ == true) {
    uStack_1a0 = uStack_1a0 & 0xffffffffffffff00;
  }
  if (oStack_1b0.set == true) {
    oStack_1b0.set = false;
  }
  if (oStack_1b8.set == true) {
    oStack_1b8.set = false;
  }
  if ((bool)auStack_1c0[4] == true) {
    auStack_1c0[4] = 0;
  }
  if (uStack_1c8._0_1_ == true) {
    uStack_1c8 = uStack_1c8 & 0xffffffffffffff00;
  }
  if ((bool)auStack_1e0[4] == true) {
    auStack_1e0[4] = 0;
  }
  if (uStack_220._0_1_ == true) {
    uStack_220 = uStack_220 & 0xffffffffffffff00;
  }
  if ((bool)local_268[4] == true) {
    local_268[4] = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  return;
}

Assistant:

void RealisticCamera::RenderExitPupil(Float sx, Float sy, const char *filename) const {
    Point3f pFilm(sx, sy, 0);

    const int nSamples = 2048;
    Image image(PixelFormat::Float, {nSamples, nSamples}, {"Y"});

    for (int y = 0; y < nSamples; ++y) {
        Float fy = (Float)y / (Float)(nSamples - 1);
        Float ly = Lerp(fy, -RearElementRadius(), RearElementRadius());
        for (int x = 0; x < nSamples; ++x) {
            Float fx = (Float)x / (Float)(nSamples - 1);
            Float lx = Lerp(fx, -RearElementRadius(), RearElementRadius());

            Point3f pRear(lx, ly, LensRearZ());

            if (lx * lx + ly * ly > RearElementRadius() * RearElementRadius())
                image.SetChannel({x, y}, 0, 1.);
            else if (TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr))
                image.SetChannel({x, y}, 0, 0.5);
            else
                image.SetChannel({x, y}, 0, 0.);
        }
    }

    image.Write(filename);
}